

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<896,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  size_type sVar2;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar3;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool in_stack_0000000b;
  bool in_stack_0000000c;
  bool in_stack_0000000d;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000010;
  bool result;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  uint32_t *in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff42;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff43;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  Blob<896> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar3 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar3 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x380,pcVar3,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12e13f);
  Blob<896>::Blob(&local_98);
  memset(&local_98,0,0x70);
  if ((local_d & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_ffffffffffffff60,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff44 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,0);
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)CONCAT44(in_ESI,in_EDX),(void *)CONCAT44(in_ECX,in_R8D),
               in_stack_ffffffffffffff44,
               CONCAT13(in_stack_ffffffffffffff43,
                        CONCAT12(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40)),
               in_stack_ffffffffffffff38);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<896>,unsigned_int>
            ((pfHash)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             SUB41(in_ESI >> 0x18,0),(Blob<896> *)CONCAT44(in_ECX,in_R8D),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,
                      CONCAT13(in_stack_ffffffffffffff43,
                               CONCAT12(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40))));
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar2 & 0xffffffff);
  bVar4 = 1;
  bVar1 = TestHashList<unsigned_int>
                    (in_stack_00000010,in_stack_0000000f,in_stack_0000000e,in_stack_0000000d,
                     in_stack_0000000c,in_stack_0000000b);
  bVar4 = bVar1 & bVar4;
  printf("\n");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}